

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O1

char * kstrtok(char *str,char *sep,ks_tokaux_t *aux)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  if (sep != (char *)0x0) {
    if ((str == (char *)0x0) && ((aux->tab[0] & 1) != 0)) {
      return (char *)0x0;
    }
    aux->finished = 0;
    if (sep[1] == '\0') {
      aux->sep = (int)*sep;
    }
    else {
      aux->sep = -1;
      aux->tab[0] = 0;
      aux->tab[1] = 0;
      aux->tab[2] = 0;
      aux->tab[3] = 0;
      bVar2 = *sep;
      if (bVar2 != 0) {
        pbVar4 = (byte *)(sep + 1);
        do {
          aux->tab[(int)(char)bVar2 >> 6] = aux->tab[(int)(char)bVar2 >> 6] | 1L << (bVar2 & 0x3f);
          bVar2 = *pbVar4;
          pbVar4 = pbVar4 + 1;
        } while (bVar2 != 0);
      }
    }
  }
  if (aux->finished != 0) {
    return (char *)0x0;
  }
  if (str != (char *)0x0) {
    aux->p = str + -1;
    aux->finished = 0;
  }
  pbVar3 = (byte *)aux->p;
  pbVar4 = pbVar3 + 1;
  if (aux->sep < 0) {
    bVar2 = *pbVar4;
    pbVar3 = pbVar4;
    while ((bVar2 != 0 && ((aux->tab[(int)(char)bVar2 >> 6] >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
      bVar2 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    }
  }
  else {
    do {
      pbVar1 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
      if (*pbVar1 == 0) break;
    } while (aux->sep != (int)(char)*pbVar1);
  }
  aux->p = (char *)pbVar3;
  if (*pbVar3 == 0) {
    aux->finished = 1;
    return (char *)pbVar4;
  }
  return (char *)pbVar4;
}

Assistant:

char *kstrtok(const char *str, const char *sep, ks_tokaux_t *aux)
{
	const char *p, *start;
	if (sep) { // set up the table
		if (str == 0 && (aux->tab[0]&1)) return 0; // no need to set up if we have finished
		aux->finished = 0;
		if (sep[1]) {
			aux->sep = -1;
			aux->tab[0] = aux->tab[1] = aux->tab[2] = aux->tab[3] = 0;
			for (p = sep; *p; ++p) aux->tab[*p>>6] |= 1ull<<(*p&0x3f);
		} else aux->sep = sep[0];
	}
	if (aux->finished) return 0;
	else if (str) aux->p = str - 1, aux->finished = 0;
	if (aux->sep < 0) {
		for (p = start = aux->p + 1; *p; ++p)
			if (aux->tab[*p>>6]>>(*p&0x3f)&1) break;
	} else {
		for (p = start = aux->p + 1; *p; ++p)
			if (*p == aux->sep) break;
	}
	aux->p = p; // end of token
	if (*p == 0) aux->finished = 1; // no more tokens
	return (char*)start;
}